

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Flt::render(V2Flt *this,float *dest,float *src,int nsamples,int step)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  switch(this->mode & 7) {
  case 0:
    if (dest == src) {
      return;
    }
    memmove(dest,src,(long)nsamples << 2);
    return;
  case 1:
    fVar9 = (this->lrc).l;
    fVar10 = (this->lrc).b;
    if (0 < nsamples) {
      uVar3 = (ulong)(uint)nsamples;
      lVar4 = 0;
      do {
        fVar7 = this->cfreq;
        fVar12 = *(float *)((long)src + lVar4) + 3.8146973e-06;
        fVar9 = fVar7 * fVar10 + -3.8146973e-06 + fVar9;
        fVar10 = ((fVar12 - fVar10 * this->res) - fVar9) * fVar7 + fVar10;
        fVar9 = fVar7 * fVar10 + fVar9;
        fVar10 = ((fVar12 - this->res * fVar10) - fVar9) * fVar7 + fVar10;
        *(float *)((long)dest + lVar4) = fVar9;
        lVar4 = lVar4 + (long)step * 4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    break;
  case 2:
    fVar9 = (this->lrc).l;
    fVar10 = (this->lrc).b;
    if (0 < nsamples) {
      uVar3 = (ulong)(uint)nsamples;
      lVar4 = 0;
      do {
        fVar7 = this->cfreq;
        fVar12 = *(float *)((long)src + lVar4) + 3.8146973e-06;
        fVar9 = fVar7 * fVar10 + -3.8146973e-06 + fVar9;
        fVar10 = ((fVar12 - fVar10 * this->res) - fVar9) * fVar7 + fVar10;
        fVar9 = fVar7 * fVar10 + fVar9;
        fVar10 = ((fVar12 - this->res * fVar10) - fVar9) * fVar7 + fVar10;
        *(float *)((long)dest + lVar4) = fVar10;
        lVar4 = lVar4 + (long)step * 4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    break;
  case 3:
    fVar9 = (this->lrc).l;
    fVar10 = (this->lrc).b;
    if (0 < nsamples) {
      uVar3 = (ulong)(uint)nsamples;
      lVar4 = 0;
      do {
        fVar7 = this->cfreq;
        fVar12 = *(float *)((long)src + lVar4) + 3.8146973e-06;
        fVar9 = fVar7 * fVar10 + -3.8146973e-06 + fVar9;
        fVar10 = ((fVar12 - fVar10 * this->res) - fVar9) * fVar7 + fVar10;
        fVar9 = fVar7 * fVar10 + fVar9;
        fVar12 = (fVar12 - this->res * fVar10) - fVar9;
        fVar10 = fVar7 * fVar12 + fVar10;
        *(float *)((long)dest + lVar4) = fVar12;
        lVar4 = lVar4 + (long)step * 4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    break;
  case 4:
    fVar9 = (this->lrc).l;
    fVar10 = (this->lrc).b;
    if (0 < nsamples) {
      uVar3 = (ulong)(uint)nsamples;
      lVar4 = 0;
      do {
        fVar7 = this->cfreq;
        fVar12 = *(float *)((long)src + lVar4) + 3.8146973e-06;
        fVar9 = fVar7 * fVar10 + -3.8146973e-06 + fVar9;
        fVar10 = ((fVar12 - fVar10 * this->res) - fVar9) * fVar7 + fVar10;
        fVar9 = fVar7 * fVar10 + fVar9;
        fVar12 = (fVar12 - this->res * fVar10) - fVar9;
        fVar10 = fVar7 * fVar12 + fVar10;
        *(float *)((long)dest + lVar4) = fVar12 + fVar9;
        lVar4 = lVar4 + (long)step * 4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    break;
  case 5:
    fVar9 = (this->lrc).l;
    fVar10 = (this->lrc).b;
    if (0 < nsamples) {
      uVar3 = (ulong)(uint)nsamples;
      lVar4 = 0;
      do {
        fVar7 = this->cfreq;
        fVar12 = *(float *)((long)src + lVar4) + 3.8146973e-06;
        fVar9 = fVar7 * fVar10 + -3.8146973e-06 + fVar9;
        fVar10 = ((fVar12 - fVar10 * this->res) - fVar9) * fVar7 + fVar10;
        fVar9 = fVar7 * fVar10 + fVar9;
        fVar12 = (fVar12 - this->res * fVar10) - fVar9;
        fVar10 = fVar7 * fVar12 + fVar10;
        *(float *)((long)dest + lVar4) = fVar9 + fVar10 + fVar12;
        lVar4 = lVar4 + (long)step * 4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    break;
  case 6:
    fVar9 = (this->moog).b[0];
    fVar10 = (this->moog).b[1];
    fVar7 = (this->moog).b[2];
    fVar12 = (this->moog).b[3];
    fVar11 = (this->moog).b[4];
    if (0 < nsamples) {
      uVar3 = (ulong)(uint)nsamples;
      lVar4 = 0;
      fVar5 = fVar9;
      do {
        fVar9 = *(float *)((long)src + lVar4);
        fVar1 = this->moogf;
        fVar2 = this->moogp;
        fVar8 = (((fVar9 + 3.8146973e-06) - this->moogq * fVar11) + fVar5) * fVar2 - fVar1 * fVar10;
        fVar6 = (fVar10 + fVar8) * fVar2 - fVar1 * fVar7;
        fVar5 = (fVar7 + fVar6) * fVar2 - fVar1 * fVar12;
        fVar10 = (fVar12 + fVar5) * fVar2 - fVar11 * fVar1;
        fVar11 = (fVar10 - fVar10 * fVar10 * fVar10 * 0.16666667) + -3.8146973e-06 + -3.8146973e-06;
        fVar10 = (((fVar9 + 3.8146973e-06) - this->moogq * fVar11) + fVar9) * fVar2 - fVar1 * fVar8;
        fVar7 = (fVar8 + fVar10) * fVar2 - fVar1 * fVar6;
        fVar12 = (fVar6 + fVar7) * fVar2 - fVar1 * fVar5;
        fVar11 = (fVar5 + fVar12) * fVar2 - fVar11 * fVar1;
        fVar11 = (fVar11 - fVar11 * fVar11 * fVar11 * 0.16666667) + -3.8146973e-06;
        *(float *)((long)dest + lVar4) = fVar11;
        fVar11 = fVar11 + -3.8146973e-06;
        lVar4 = lVar4 + (long)step * 4;
        uVar3 = uVar3 - 1;
        fVar5 = fVar9;
      } while (uVar3 != 0);
    }
    (this->moog).b[0] = fVar9;
    (this->moog).b[1] = fVar10;
    (this->moog).b[2] = fVar7;
    goto LAB_0010b165;
  case 7:
    fVar9 = (this->moog).b[0];
    fVar10 = (this->moog).b[1];
    fVar7 = (this->moog).b[2];
    fVar12 = (this->moog).b[3];
    fVar11 = (this->moog).b[4];
    if (0 < nsamples) {
      uVar3 = (ulong)(uint)nsamples;
      lVar4 = 0;
      fVar5 = fVar9;
      do {
        fVar9 = *(float *)((long)src + lVar4);
        fVar1 = this->moogf;
        fVar2 = this->moogp;
        fVar6 = (((fVar9 + 3.8146973e-06) - this->moogq * fVar11) + fVar5) * fVar2 - fVar1 * fVar10;
        fVar8 = (fVar10 + fVar6) * fVar2 - fVar1 * fVar7;
        fVar5 = (fVar7 + fVar8) * fVar2 - fVar1 * fVar12;
        fVar10 = (fVar12 + fVar5) * fVar2 - fVar11 * fVar1;
        fVar11 = (fVar10 - fVar10 * fVar10 * fVar10 * 0.16666667) + -3.8146973e-06 + -3.8146973e-06;
        fVar10 = (((fVar9 + 3.8146973e-06) - this->moogq * fVar11) + fVar9) * fVar2 - fVar1 * fVar6;
        fVar7 = (fVar6 + fVar10) * fVar2 - fVar1 * fVar8;
        fVar12 = (fVar8 + fVar7) * fVar2 - fVar1 * fVar5;
        fVar11 = (fVar5 + fVar12) * fVar2 - fVar11 * fVar1;
        fVar5 = (fVar11 - fVar11 * fVar11 * fVar11 * 0.16666667) + -3.8146973e-06;
        fVar11 = fVar5 + -3.8146973e-06;
        *(float *)((long)dest + lVar4) = fVar9 - fVar5;
        lVar4 = lVar4 + (long)step * 4;
        uVar3 = uVar3 - 1;
        fVar5 = fVar9;
      } while (uVar3 != 0);
    }
    (this->moog).b[0] = fVar9;
    (this->moog).b[1] = fVar10;
    (this->moog).b[2] = fVar7;
LAB_0010b165:
    (this->moog).b[3] = fVar12;
    (this->moog).b[4] = fVar11;
    return;
  }
  (this->lrc).l = fVar9;
  (this->lrc).b = fVar10;
  return;
}

Assistant:

void render(float *dest, const float *src, int nsamples, int step=1)
    {
        V2LRC flt;
        V2Moog m;

        switch (mode & 7)
        {
        case BYPASS:
            COVER("VCF bypass");
            // @@@BUG ignores step? this is wrong but I suppose this
            // never gets hit for stereo case.
            if (dest != src)
                memmove(dest, src, nsamples * sizeof(float));
            break;

        case LOW:
            COVER("VCF low");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l;
            }
            lrc = flt;
            break;

        case BAND:
            COVER("VCF band");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.b;
            }
            lrc = flt;
            break;

        case HIGH:
            COVER("VCF high");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = h;
            }
            lrc = flt;
            break;

        case NOTCH:
            COVER("VCF notch");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + h;
            }
            lrc = flt;
            break;

        case ALL:
            COVER("VCF all");
            flt = lrc;
            for (int i=0; i < nsamples; i++)
            {
                float h = flt.step_2x(src[i*step], cfreq, res);
                dest[i*step] = flt.l + flt.b + h;
            }
            lrc = flt;
            break;

        case MOOGL:
            COVER("VCF moog low");
            // Moog filters are 2x oversampled, so run filter twice.
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;

        case MOOGH:
            COVER("VCF moog high");
            m = moog;
            for (int i=0; i < nsamples; i++)
            {
                float in = src[i*step];
                m.step(in, moogf, moogp, moogq);
                dest[i*step] = in - m.step(in, moogf, moogp, moogq);
            }
            moog = m;
            break;
        }

        DEBUG_PLOT_STRIDED(this, dest, step, nsamples);
    }